

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# injectionmanager.h
# Opt level: O3

void injection::InjectionManager::bind_singleton<ITest>(function<ITest_*()> *maker)

{
  _Any_data _Stack_28;
  _Manager_type local_18;
  
  std::function<ITest_*()>::function((function<ITest_*()> *)&_Stack_28,maker);
  bind<ITest>((function<ITest_*()> *)&_Stack_28,SINGLETON);
  if (local_18 != (code *)0x0) {
    (*local_18)(&_Stack_28,&_Stack_28,__destroy_functor);
  }
  return;
}

Assistant:

static void bind_singleton(std::function<I*()> maker) {
        InjectionManager::bind<I>(maker, InjectionScope::SINGLETON);
    }